

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

torrent_peer * __thiscall
libtorrent::aux::peer_list::add_peer
          (peer_list *this,endpoint *remote,peer_source_flags_t src,pex_flags_t flags,
          torrent_state *state)

{
  in_port_t iVar1;
  ushort uVar2;
  torrent_peer *p;
  anon_enum_32 aVar3;
  int iVar4;
  _Elt_pointer pptVar5;
  undefined4 extraout_var;
  bool bVar6;
  match_peer_endpoint __pred;
  _Map_pointer local_178;
  address remote_address;
  _Elt_pointer local_148;
  _Elt_pointer pptStack_140;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_138;
  pair<std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>,_std::_Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>_>
  range;
  _Elt_pointer local_d8;
  _Elt_pointer pptStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  _Elt_pointer local_b8;
  _Elt_pointer pptStack_b0;
  _Elt_pointer local_a8;
  _Map_pointer ppptStack_a0;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_98;
  _Deque_iterator<libtorrent::aux::torrent_peer_*,_libtorrent::aux::torrent_peer_*&,_libtorrent::aux::torrent_peer_**>
  local_78;
  iterator local_50;
  ipv6_peer *this_00;
  
  bVar6 = (remote->impl_).data_.base.sa_family != 2;
  if (bVar6) {
    remote_address.ipv6_address_.addr_.__in6_u._0_8_ =
         *(undefined8 *)((long)&(remote->impl_).data_ + 8);
    remote_address.ipv6_address_.addr_.__in6_u._8_8_ =
         *(undefined8 *)((long)&(remote->impl_).data_ + 0x10);
    remote_address.ipv6_address_.scope_id_ = (unsigned_long)(remote->impl_).data_.v6.sin6_scope_id;
    remote_address.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
  }
  else {
    remote_address.ipv4_address_.addr_.s_addr =
         (in4_addr_type)(remote->impl_).data_.v4.sin_addr.s_addr;
    remote_address.ipv6_address_.addr_.__in6_u._0_8_ = 0;
    remote_address.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    remote_address.ipv6_address_.scope_id_ = 0;
  }
  remote_address.type_ = (anon_enum_32)bVar6;
  range.first._M_last = (_Elt_pointer)0x0;
  range.first._M_node = (_Map_pointer)0x0;
  range.first._M_cur = (_Elt_pointer)0x0;
  range.first._M_first = (_Elt_pointer)0x0;
  bVar6 = boost::asio::ip::operator==(&remote_address,(address *)&range);
  if (((!bVar6) && (iVar1 = (remote->impl_).data_.v4.sin_port, iVar1 != 0)) && (iVar1 != 0x100)) {
    if (remote_address.type_ == ipv6) {
      boost::asio::ip::address::to_v6((address_v6 *)&range,&remote_address);
    }
    if (state->allow_multiple_connections_per_ip == true) {
      find_peers(&range,this,&remote_address);
      local_78._M_cur = range.first._M_cur;
      local_78._M_first = range.first._M_first;
      local_78._M_last = range.first._M_last;
      local_78._M_node = range.first._M_node;
      local_98._M_cur = range.second._M_cur;
      local_98._M_first = range.second._M_first;
      local_98._M_last = range.second._M_last;
      local_98._M_node = range.second._M_node;
      uVar2 = (remote->impl_).data_.v4.sin_port;
      __pred.m_port = uVar2 << 8 | uVar2 >> 8;
      __pred.m_addr = &remote_address;
      __pred._10_6_ = 0;
      ::std::
      find_if<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,(anonymous_namespace)::match_peer_endpoint>
                (&local_138,&local_78,&local_98,__pred);
      if (local_138._M_cur != range.second._M_cur) {
LAB_0025af6a:
        p = *local_138._M_cur;
        update_peer(this,p,src,flags,remote);
        state->first_time_seen = false;
        return p;
      }
      local_148 = local_138._M_first;
      pptStack_140 = local_138._M_last;
      local_178 = local_138._M_node;
      pptVar5 = local_138._M_cur;
    }
    else {
      local_b8 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptStack_b0 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_a8 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppptStack_a0 = (this->m_peers).
                     super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_d8 = (this->m_peers).
                 super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pptStack_d0 = (this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_c8 = *(undefined4 *)
                  &(this->m_peers).
                   super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   .
                   super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_last;
      uStack_c4 = *(undefined4 *)
                   ((long)&(this->m_peers).
                           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           .
                           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
      uStack_c0 = *(undefined4 *)
                   &(this->m_peers).
                    super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
      uStack_bc = *(undefined4 *)
                   ((long)&(this->m_peers).
                           super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           .
                           super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
      ::std::
      lower_bound<std::_Deque_iterator<libtorrent::aux::torrent_peer*,libtorrent::aux::torrent_peer*&,libtorrent::aux::torrent_peer**>,boost::asio::ip::address,libtorrent::aux::peer_address_compare>
                (&range,&local_b8,&local_d8,&remote_address);
      local_138._M_cur = range.first._M_cur;
      local_148 = range.first._M_first;
      pptStack_140 = range.first._M_last;
      local_178 = range.first._M_node;
      pptVar5 = local_138._M_cur;
      if (range.first._M_cur !=
          (this->m_peers).
          super_deque<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          .
          super__Deque_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        torrent_peer::address(*range.first._M_cur);
        bVar6 = boost::asio::ip::operator==((address *)&range,&remote_address);
        if (bVar6) goto LAB_0025af6a;
      }
    }
    aVar3 = remote_address.type_;
    iVar4 = (**this->m_peer_allocator->_vptr_torrent_peer_allocator_interface)
                      (this->m_peer_allocator,(ulong)(remote_address.type_ == ipv6));
    this_00 = (ipv6_peer *)CONCAT44(extraout_var,iVar4);
    if (this_00 != (ipv6_peer *)0x0) {
      if (aVar3 == ipv6) {
        ipv6_peer::ipv6_peer(this_00,remote,true,src);
      }
      else {
        ipv4_peer::ipv4_peer((ipv4_peer *)this_00,remote,true,src);
      }
      local_50._M_first = local_148;
      local_50._M_last = pptStack_140;
      local_50._M_node = local_178;
      local_50._M_cur = pptVar5;
      bVar6 = insert_peer(this,(torrent_peer *)this_00,&local_50,flags,state);
      if (bVar6) {
        state->first_time_seen = true;
        return &this_00->super_torrent_peer;
      }
      (*this->m_peer_allocator->_vptr_torrent_peer_allocator_interface[1])
                (this->m_peer_allocator,this_00);
    }
  }
  return (torrent_peer *)0x0;
}

Assistant:

torrent_peer* peer_list::add_peer(tcp::endpoint const& remote
		, peer_source_flags_t const src, pex_flags_t const flags
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		auto const remote_address = remote.address();

		// just ignore the obviously invalid entries
		if (remote_address == address() || remote.port() == 0 || remote.port() == 1)
			return nullptr;

		// don't allow link-local IPv6 addresses since they
		// can't be used like normal addresses, they require an interface
		// and will just cause connect() to fail with EINVAL
		if (remote_address.is_v6() && remote_address.to_v6().is_link_local())
			return nullptr;

		iterator iter;
		torrent_peer* p = nullptr;

		bool found = false;
		if (state->allow_multiple_connections_per_ip)
		{
			auto const range = find_peers(remote_address);
			iter = std::find_if(range.first, range.second
				, match_peer_endpoint(remote_address, remote.port()));
			if (iter != range.second) found = true;
		}
		else
		{
			iter = std::lower_bound(m_peers.begin(), m_peers.end()
				, remote_address, peer_address_compare());

			if (iter != m_peers.end() && (*iter)->address() == remote_address) found = true;
		}

		if (!found)
		{
			// we don't have any info about this peer.
			// add a new entry

			bool const is_v6 = remote_address.is_v6();
			p = m_peer_allocator.allocate_peer_entry(
				is_v6 ? torrent_peer_allocator_interface::ipv6_peer_type
				: torrent_peer_allocator_interface::ipv4_peer_type);
			if (p == nullptr) return nullptr;

			if (is_v6)
				p = new (p) ipv6_peer(remote, true, src);
			else
				p = new (p) ipv4_peer(remote, true, src);

			try
			{
				if (!insert_peer(p, iter, flags, state))
				{
					m_peer_allocator.free_peer_entry(p);
					return nullptr;
				}
			}
			catch (std::exception const&)
			{
				m_peer_allocator.free_peer_entry(p);
				return nullptr;
			}
			state->first_time_seen = true;
		}
		else
		{
			p = *iter;
			TORRENT_ASSERT(p->in_use);
			update_peer(p, src, flags, remote);
			state->first_time_seen = false;
		}

		return p;
	}